

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O1

optional<CService> * GetLocalAddrForPeer(optional<CService> *__return_storage_ptr__,CNode *node)

{
  bool bVar1;
  Network net;
  iterator iVar2;
  uint64_t uVar3;
  Logger *this;
  int bits;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view source_file;
  NodeId local_108;
  FastRandomContext rng;
  CService addrLocal;
  CService local_50;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  GetLocalAddress(&addrLocal,node);
  FastRandomContext::FastRandomContext(&rng,false);
  CNode::GetAddrLocal(&local_50,node);
  if (fDiscover == true) {
    bVar1 = CNetAddr::IsRoutable((CNetAddr *)&node->addr);
    if (!bVar1) goto LAB_0019d8f6;
    bVar1 = CNetAddr::IsRoutable(&local_50.super_CNetAddr);
    if (!bVar1) goto LAB_0019d8f6;
    net = CNetAddr::GetNetwork(&local_50.super_CNetAddr);
    bVar1 = ReachableNets::Contains(&g_reachable_nets,net);
  }
  else {
LAB_0019d8f6:
    bVar1 = false;
  }
  if (0x10 < local_50.super_CNetAddr.m_addr._size) {
    free(local_50.super_CNetAddr.m_addr._union.indirect_contents.indirect);
    local_50.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)0x0;
  }
  if (bVar1 != false) {
    bVar1 = CNetAddr::IsRoutable(&addrLocal.super_CNetAddr);
    if (bVar1) {
      local_50.super_CNetAddr.m_addr._union.indirect_contents.indirect =
           (char *)&g_maplocalhost_mutex;
      local_50.super_CNetAddr.m_addr._union.direct[8] = '\0';
      std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)&local_50);
      iVar2 = std::
              _Rb_tree<CNetAddr,_std::pair<const_CNetAddr,_LocalServiceInfo>,_std::_Select1st<std::pair<const_CNetAddr,_LocalServiceInfo>_>,_std::less<CNetAddr>,_std::allocator<std::pair<const_CNetAddr,_LocalServiceInfo>_>_>
              ::find(&mapLocalHost._M_t,&addrLocal.super_CNetAddr);
      if ((_Rb_tree_header *)iVar2._M_node == &mapLocalHost._M_t._M_impl.super__Rb_tree_header) {
        bits = 1;
      }
      else {
        bits = (uint)(4 < (int)iVar2._M_node[2]._M_color) * 2 + 1;
      }
      std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&local_50);
      uVar3 = RandomMixin<FastRandomContext>::randbits
                        (&rng.super_RandomMixin<FastRandomContext>,bits);
      if (uVar3 != 0) goto LAB_0019da66;
    }
    if (node->m_conn_type == INBOUND) {
      CNode::GetAddrLocal(&local_50,node);
      if (0x10 < addrLocal.super_CNetAddr.m_addr._size) {
        free(addrLocal.super_CNetAddr.m_addr._union.indirect_contents.indirect);
      }
      addrLocal.super_CNetAddr.m_addr._union._8_8_ =
           CONCAT71(local_50.super_CNetAddr.m_addr._union._9_7_,
                    local_50.super_CNetAddr.m_addr._union.direct[8]);
      addrLocal.super_CNetAddr.m_addr._union.indirect_contents.indirect =
           local_50.super_CNetAddr.m_addr._union.indirect_contents.indirect;
      addrLocal.super_CNetAddr.m_addr._size = local_50.super_CNetAddr.m_addr._size;
      addrLocal.super_CNetAddr.m_net = local_50.super_CNetAddr.m_net;
      addrLocal.super_CNetAddr.m_scope_id = local_50.super_CNetAddr.m_scope_id;
      addrLocal.port = local_50.port;
    }
    else {
      CNode::GetAddrLocal(&local_50,node);
      CNetAddr::SetIP(&addrLocal.super_CNetAddr,&local_50.super_CNetAddr);
      if (0x10 < local_50.super_CNetAddr.m_addr._size) {
        free(local_50.super_CNetAddr.m_addr._union.indirect_contents.indirect);
        local_50.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)0x0;
      }
    }
  }
LAB_0019da66:
  bVar1 = CNetAddr::IsRoutable(&addrLocal.super_CNetAddr);
  if (bVar1) {
    this = LogInstance();
    bVar1 = BCLog::Logger::WillLogCategoryLevel(this,NET,Debug);
    if (bVar1) {
      CService::ToStringAddrPort_abi_cxx11_((string *)&local_50,&addrLocal);
      local_108 = node->id;
      logging_function._M_str = "GetLocalAddrForPeer";
      logging_function._M_len = 0x13;
      source_file._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
      ;
      source_file._M_len = 0x57;
      LogPrintFormatInternal<std::__cxx11::string,long>
                (logging_function,source_file,0x104,NET,Debug,(ConstevalFormatString<2U>)0x7e5920,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_50,
                 &local_108);
      if ((size_type *)local_50.super_CNetAddr.m_addr._union.indirect_contents.indirect !=
          &local_50.super_CNetAddr.m_addr._size) {
        operator_delete(local_50.super_CNetAddr.m_addr._union.indirect_contents.indirect,
                        CONCAT44(local_50.super_CNetAddr.m_addr._20_4_,
                                 local_50.super_CNetAddr.m_addr._size) + 1);
      }
    }
    *(char **)&(__return_storage_ptr__->super__Optional_base<CService,_false,_false>)._M_payload.
               super__Optional_payload<CService,_true,_false,_false>.
               super__Optional_payload_base<CService>._M_payload =
         addrLocal.super_CNetAddr.m_addr._union.indirect_contents.indirect;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<CService,_false,_false>)._M_payload.
             super__Optional_payload<CService,_true,_false,_false>.
             super__Optional_payload_base<CService>._M_payload + 8) =
         addrLocal.super_CNetAddr.m_addr._union._8_8_;
    *(size_type *)
     ((long)&(__return_storage_ptr__->super__Optional_base<CService,_false,_false>)._M_payload.
             super__Optional_payload<CService,_true,_false,_false>.
             super__Optional_payload_base<CService>._M_payload + 0x10) =
         addrLocal.super_CNetAddr.m_addr._size;
    addrLocal.super_CNetAddr.m_addr._size = 0;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<CService,_false,_false>)._M_payload.
             super__Optional_payload<CService,_true,_false,_false>.
             super__Optional_payload_base<CService>._M_payload + 0x18) =
         addrLocal.super_CNetAddr._24_8_;
    (__return_storage_ptr__->super__Optional_base<CService,_false,_false>)._M_payload.
    super__Optional_payload<CService,_true,_false,_false>.super__Optional_payload_base<CService>.
    _M_payload._M_value.port = addrLocal.port;
    bVar1 = true;
  }
  else {
    bVar1 = false;
  }
  (__return_storage_ptr__->super__Optional_base<CService,_false,_false>)._M_payload.
  super__Optional_payload<CService,_true,_false,_false>.super__Optional_payload_base<CService>.
  _M_engaged = bVar1;
  ChaCha20::~ChaCha20(&rng.rng);
  if (0x10 < addrLocal.super_CNetAddr.m_addr._size) {
    free(addrLocal.super_CNetAddr.m_addr._union.indirect_contents.indirect);
    addrLocal.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<CService> GetLocalAddrForPeer(CNode& node)
{
    CService addrLocal{GetLocalAddress(node)};
    // If discovery is enabled, sometimes give our peer the address it
    // tells us that it sees us as in case it has a better idea of our
    // address than we do.
    FastRandomContext rng;
    if (IsPeerAddrLocalGood(&node) && (!addrLocal.IsRoutable() ||
         rng.randbits((GetnScore(addrLocal) > LOCAL_MANUAL) ? 3 : 1) == 0))
    {
        if (node.IsInboundConn()) {
            // For inbound connections, assume both the address and the port
            // as seen from the peer.
            addrLocal = CService{node.GetAddrLocal()};
        } else {
            // For outbound connections, assume just the address as seen from
            // the peer and leave the port in `addrLocal` as returned by
            // `GetLocalAddress()` above. The peer has no way to observe our
            // listening port when we have initiated the connection.
            addrLocal.SetIP(node.GetAddrLocal());
        }
    }
    if (addrLocal.IsRoutable()) {
        LogDebug(BCLog::NET, "Advertising address %s to peer=%d\n", addrLocal.ToStringAddrPort(), node.GetId());
        return addrLocal;
    }
    // Address is unroutable. Don't advertise.
    return std::nullopt;
}